

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# slhdsa_test.cc
# Opt level: O0

void __thiscall
anon_unknown.dwarf_45c6fa::SLHDSATest_BasicNonstandardPrehashSignVerify_Test::TestBody
          (SLHDSATest_BasicNonstandardPrehashSignVerify_Test *this)

{
  bool bVar1;
  int iVar2;
  char *pcVar3;
  uint8_t *context;
  string local_2200;
  AssertHelper local_21e0;
  Message local_21d8;
  bool local_21c9;
  undefined1 local_21c8 [8];
  AssertionResult gtest_ar__2;
  uint8_t kWrongLengthHash [16];
  AssertHelper local_21a0;
  Message local_2198;
  int local_2190;
  int local_218c;
  undefined1 local_2188 [8];
  AssertionResult gtest_ar_3;
  AssertHelper local_2158;
  Message local_2150;
  int local_2144;
  undefined1 local_2140 [8];
  AssertionResult gtest_ar__1;
  Message local_2128;
  int local_2120;
  int local_211c;
  undefined1 local_2118 [8];
  AssertionResult gtest_ar_2;
  Message local_2100;
  int local_20f8;
  int local_20f4;
  undefined1 local_20f0 [8];
  AssertionResult gtest_ar_1;
  Message local_20d8;
  int local_20d0;
  int local_20cc;
  undefined1 local_20c8 [8];
  AssertionResult gtest_ar;
  string local_20b0;
  AssertHelper local_2090 [3];
  Message local_2078;
  int local_206c;
  undefined1 local_2068 [8];
  AssertionResult gtest_ar_;
  uint8_t signature [7856];
  uint8_t kContext [256];
  uint8_t kHashedMessage [48];
  uint8_t priv [64];
  uint8_t pub [32];
  SLHDSATest_BasicNonstandardPrehashSignVerify_Test *this_local;
  
  SLHDSA_SHA2_128S_generate_key(priv + 0x38,kHashedMessage + 0x28);
  memset(kContext + 0xf8,0,0x30);
  kContext[0xf8] = 'B';
  memset(signature + 0x1ea8,0,0x100);
  pcVar3 = (char *)0x0;
  local_206c = SLHDSA_SHA2_128S_prehash_warning_nonstandard_sign
                         ((uint8_t *)&gtest_ar_.message_,kHashedMessage + 0x28,kContext + 0xf8,0x30,
                          0x2a1,(uint8_t *)0x0,0);
  testing::AssertionResult::AssertionResult<int>
            ((AssertionResult *)local_2068,&local_206c,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_2068);
  if (!bVar1) {
    testing::Message::Message(&local_2078);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_20b0,(internal *)local_2068,
               (AssertionResult *)
               "SLHDSA_SHA2_128S_prehash_warning_nonstandard_sign( signature, priv, kHashedMessage, sizeof(kHashedMessage), 673, nullptr, 0)"
               ,"false","true",pcVar3);
    pcVar3 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (local_2090,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/slhdsa/slhdsa_test.cc"
               ,0x60,pcVar3);
    testing::internal::AssertHelper::operator=(local_2090,&local_2078);
    testing::internal::AssertHelper::~AssertHelper(local_2090);
    std::__cxx11::string::~string((string *)&local_20b0);
    testing::Message::~Message(&local_2078);
  }
  gtest_ar.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl._5_3_ = 0;
  gtest_ar.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl._4_1_ = !bVar1;
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_2068);
  if (gtest_ar.message_._M_t.
      super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
      ._M_head_impl._4_4_ == 0) {
    local_20cc = SLHDSA_SHA2_128S_prehash_warning_nonstandard_verify
                           ((uint8_t *)&gtest_ar_.message_,0x1eb0,priv + 0x38,kContext + 0xf8,0x30,
                            0x2a1,(uint8_t *)0x0,0);
    local_20d0 = 1;
    testing::internal::EqHelper::Compare<int,_int,_nullptr>
              ((EqHelper *)local_20c8,
               "SLHDSA_SHA2_128S_prehash_warning_nonstandard_verify( signature, sizeof(signature), pub, kHashedMessage, sizeof(kHashedMessage), 673, nullptr, 0)"
               ,"1",&local_20cc,&local_20d0);
    bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_20c8);
    if (!bVar1) {
      testing::Message::Message(&local_20d8);
      pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_20c8);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&gtest_ar_1.message_,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/slhdsa/slhdsa_test.cc"
                 ,100,pcVar3);
      testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_1.message_,&local_20d8);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_1.message_);
      testing::Message::~Message(&local_20d8);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_20c8);
    local_20f4 = SLHDSA_SHA2_128S_prehash_warning_nonstandard_verify
                           ((uint8_t *)&gtest_ar_.message_,0x1eb0,priv + 0x38,kContext + 0xf8,0x30,
                            0x2a1,signature + 0x1ea8,1);
    local_20f8 = 0;
    testing::internal::EqHelper::Compare<int,_int,_nullptr>
              ((EqHelper *)local_20f0,
               "SLHDSA_SHA2_128S_prehash_warning_nonstandard_verify( signature, sizeof(signature), pub, kHashedMessage, sizeof(kHashedMessage), 673, kContext, 1)"
               ,"0",&local_20f4,&local_20f8);
    bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_20f0);
    if (!bVar1) {
      testing::Message::Message(&local_2100);
      pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_20f0);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&gtest_ar_2.message_,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/slhdsa/slhdsa_test.cc"
                 ,0x68,pcVar3);
      testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_2.message_,&local_2100);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_2.message_);
      testing::Message::~Message(&local_2100);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_20f0);
    local_211c = SLHDSA_SHA2_128S_prehash_warning_nonstandard_verify
                           ((uint8_t *)&gtest_ar_.message_,0x1eb0,priv + 0x38,kContext + 0xf8,0x30,
                            0x2a1,signature + 0x1ea8,0x100);
    local_2120 = 0;
    testing::internal::EqHelper::Compare<int,_int,_nullptr>
              ((EqHelper *)local_2118,
               "SLHDSA_SHA2_128S_prehash_warning_nonstandard_verify( signature, sizeof(signature), pub, kHashedMessage, sizeof(kHashedMessage), 673, kContext, 256)"
               ,"0",&local_211c,&local_2120);
    bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_2118);
    if (!bVar1) {
      testing::Message::Message(&local_2128);
      pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_2118);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&gtest_ar__1.message_,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/slhdsa/slhdsa_test.cc"
                 ,0x6c,pcVar3);
      testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar__1.message_,&local_2128);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar__1.message_);
      testing::Message::~Message(&local_2128);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_2118);
    context = signature + 0x1ea8;
    local_2144 = SLHDSA_SHA2_128S_prehash_warning_nonstandard_sign
                           ((uint8_t *)&gtest_ar_.message_,kHashedMessage + 0x28,kContext + 0xf8,
                            0x30,0x2a1,context,1);
    testing::AssertionResult::AssertionResult<int>
              ((AssertionResult *)local_2140,&local_2144,(type *)0x0);
    bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_2140);
    if (!bVar1) {
      testing::Message::Message(&local_2150);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((string *)&gtest_ar_3.message_,(internal *)local_2140,
                 (AssertionResult *)
                 "SLHDSA_SHA2_128S_prehash_warning_nonstandard_sign( signature, priv, kHashedMessage, sizeof(kHashedMessage), 673, kContext, 1)"
                 ,"false","true",(char *)context);
      pcVar3 = (char *)std::__cxx11::string::c_str();
      testing::internal::AssertHelper::AssertHelper
                (&local_2158,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/slhdsa/slhdsa_test.cc"
                 ,0x70,pcVar3);
      testing::internal::AssertHelper::operator=(&local_2158,&local_2150);
      testing::internal::AssertHelper::~AssertHelper(&local_2158);
      std::__cxx11::string::~string((string *)&gtest_ar_3.message_);
      testing::Message::~Message(&local_2150);
    }
    gtest_ar.message_._M_t.
    super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
    ._M_head_impl._5_3_ = 0;
    gtest_ar.message_._M_t.
    super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
    ._M_head_impl._4_1_ = !bVar1;
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_2140);
    if (gtest_ar.message_._M_t.
        super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_t.
        super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        .
        super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
        ._M_head_impl._4_4_ == 0) {
      local_218c = SLHDSA_SHA2_128S_prehash_warning_nonstandard_verify
                             ((uint8_t *)&gtest_ar_.message_,0x1eb0,priv + 0x38,kContext + 0xf8,0x30
                              ,0x2a1,signature + 0x1ea8,1);
      local_2190 = 1;
      testing::internal::EqHelper::Compare<int,_int,_nullptr>
                ((EqHelper *)local_2188,
                 "SLHDSA_SHA2_128S_prehash_warning_nonstandard_verify( signature, sizeof(signature), pub, kHashedMessage, sizeof(kHashedMessage), 673, kContext, 1)"
                 ,"1",&local_218c,&local_2190);
      bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_2188);
      if (!bVar1) {
        testing::Message::Message(&local_2198);
        pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_2188);
        testing::internal::AssertHelper::AssertHelper
                  (&local_21a0,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/slhdsa/slhdsa_test.cc"
                   ,0x74,pcVar3);
        testing::internal::AssertHelper::operator=(&local_21a0,&local_2198);
        testing::internal::AssertHelper::~AssertHelper(&local_21a0);
        testing::Message::~Message(&local_2198);
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)local_2188);
      gtest_ar__2.message_._M_t.
      super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
      ._M_head_impl =
           (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
            )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              )0x42;
      pcVar3 = (char *)0x0;
      iVar2 = SLHDSA_SHA2_128S_prehash_warning_nonstandard_sign
                        ((uint8_t *)&gtest_ar_.message_,kHashedMessage + 0x28,
                         (uint8_t *)&gtest_ar__2.message_,0x10,0x2a1,(uint8_t *)0x0,0);
      local_21c9 = (bool)((iVar2 != 0 ^ 0xffU) & 1);
      testing::AssertionResult::AssertionResult<bool>
                ((AssertionResult *)local_21c8,&local_21c9,(type *)0x0);
      bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_21c8);
      if (!bVar1) {
        testing::Message::Message(&local_21d8);
        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                  (&local_2200,(internal *)local_21c8,
                   (AssertionResult *)
                   "SLHDSA_SHA2_128S_prehash_warning_nonstandard_sign( signature, priv, kWrongLengthHash, sizeof(kWrongLengthHash), 673, nullptr, 0)"
                   ,"true","false",pcVar3);
        pcVar3 = (char *)std::__cxx11::string::c_str();
        testing::internal::AssertHelper::AssertHelper
                  (&local_21e0,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/slhdsa/slhdsa_test.cc"
                   ,0x79,pcVar3);
        testing::internal::AssertHelper::operator=(&local_21e0,&local_21d8);
        testing::internal::AssertHelper::~AssertHelper(&local_21e0);
        std::__cxx11::string::~string((string *)&local_2200);
        testing::Message::~Message(&local_21d8);
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)local_21c8);
    }
  }
  return;
}

Assistant:

TEST(SLHDSATest, BasicNonstandardPrehashSignVerify) {
  uint8_t pub[SLHDSA_SHA2_128S_PUBLIC_KEY_BYTES];
  uint8_t priv[SLHDSA_SHA2_128S_PRIVATE_KEY_BYTES];
  SLHDSA_SHA2_128S_generate_key(pub, priv);

  // Use a constant 48-byte value as the prehashed message
  uint8_t kHashedMessage[48] = {0x42};
  uint8_t kContext[256] = {0};
  uint8_t signature[SLHDSA_SHA2_128S_SIGNATURE_BYTES];
  ASSERT_TRUE(SLHDSA_SHA2_128S_prehash_warning_nonstandard_sign(
      signature, priv, kHashedMessage, sizeof(kHashedMessage), NID_sha384,
      nullptr, 0));
  EXPECT_EQ(SLHDSA_SHA2_128S_prehash_warning_nonstandard_verify(
                signature, sizeof(signature), pub, kHashedMessage,
                sizeof(kHashedMessage), NID_sha384, nullptr, 0),
            1);
  EXPECT_EQ(SLHDSA_SHA2_128S_prehash_warning_nonstandard_verify(
                signature, sizeof(signature), pub, kHashedMessage,
                sizeof(kHashedMessage), NID_sha384, kContext, 1),
            0);
  EXPECT_EQ(SLHDSA_SHA2_128S_prehash_warning_nonstandard_verify(
                signature, sizeof(signature), pub, kHashedMessage,
                sizeof(kHashedMessage), NID_sha384, kContext, 256),
            0);

  ASSERT_TRUE(SLHDSA_SHA2_128S_prehash_warning_nonstandard_sign(
      signature, priv, kHashedMessage, sizeof(kHashedMessage), NID_sha384,
      kContext, 1));
  EXPECT_EQ(SLHDSA_SHA2_128S_prehash_warning_nonstandard_verify(
                signature, sizeof(signature), pub, kHashedMessage,
                sizeof(kHashedMessage), NID_sha384, kContext, 1),
            1);

  uint8_t kWrongLengthHash[16] = {0x42};
  EXPECT_FALSE(SLHDSA_SHA2_128S_prehash_warning_nonstandard_sign(
      signature, priv, kWrongLengthHash, sizeof(kWrongLengthHash), NID_sha384,
      nullptr, 0));
}